

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reconintra.c
# Opt level: O0

void dr_predictor(uint8_t *dst,ptrdiff_t stride,TX_SIZE tx_size,uint8_t *above,uint8_t *left,
                 int upsample_above,int upsample_left,int angle)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  uint8_t *in_RCX;
  byte in_DL;
  ptrdiff_t in_RSI;
  uint8_t *in_RDI;
  uint8_t *in_R8;
  int in_R9D;
  int in_stack_00000008;
  int in_stack_00000010;
  int bh;
  int bw;
  int dy;
  int dx;
  
  iVar3 = av1_get_dx(in_stack_00000010);
  iVar4 = av1_get_dy(in_stack_00000010);
  iVar1 = tx_size_wide[in_DL];
  iVar2 = tx_size_high[in_DL];
  if ((in_stack_00000010 < 1) || (0x59 < in_stack_00000010)) {
    if ((in_stack_00000010 < 0x5b) || (0xb3 < in_stack_00000010)) {
      if ((in_stack_00000010 < 0xb5) || (0x10d < in_stack_00000010)) {
        if (in_stack_00000010 == 0x5a) {
          (*pred[1][in_DL])(in_RDI,in_RSI,in_RCX,in_R8);
        }
        else if (in_stack_00000010 == 0xb4) {
          (*pred[2][in_DL])(in_RDI,in_RSI,in_RCX,in_R8);
        }
      }
      else {
        (*av1_dr_prediction_z3)
                  (in_RDI,in_RSI,iVar1,iVar2,in_RCX,in_R8,in_stack_00000008,iVar3,iVar4);
      }
    }
    else {
      (*av1_dr_prediction_z2)
                (in_RDI,in_RSI,iVar1,iVar2,in_RCX,in_R8,in_R9D,in_stack_00000008,iVar3,iVar4);
    }
  }
  else {
    (*av1_dr_prediction_z1)(in_RDI,in_RSI,iVar1,iVar2,in_RCX,in_R8,in_R9D,iVar3,iVar4);
  }
  return;
}

Assistant:

static void dr_predictor(uint8_t *dst, ptrdiff_t stride, TX_SIZE tx_size,
                         const uint8_t *above, const uint8_t *left,
                         int upsample_above, int upsample_left, int angle) {
  const int dx = av1_get_dx(angle);
  const int dy = av1_get_dy(angle);
  const int bw = tx_size_wide[tx_size];
  const int bh = tx_size_high[tx_size];
  assert(angle > 0 && angle < 270);

  if (angle > 0 && angle < 90) {
    av1_dr_prediction_z1(dst, stride, bw, bh, above, left, upsample_above, dx,
                         dy);
  } else if (angle > 90 && angle < 180) {
    av1_dr_prediction_z2(dst, stride, bw, bh, above, left, upsample_above,
                         upsample_left, dx, dy);
  } else if (angle > 180 && angle < 270) {
    av1_dr_prediction_z3(dst, stride, bw, bh, above, left, upsample_left, dx,
                         dy);
  } else if (angle == 90) {
    pred[V_PRED][tx_size](dst, stride, above, left);
  } else if (angle == 180) {
    pred[H_PRED][tx_size](dst, stride, above, left);
  }
}